

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O0

void CAddress::
     SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress,ActionUnserialize>
               (undefined8 param_1,CService *param_2)

{
  long lVar1;
  SerParams *pSVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  bool bVar4;
  SerParams *params;
  bool use_v2;
  SerParams ser_params;
  uint64_t services_tmp;
  uint32_t stored_format_version;
  CAddress *in_stack_ffffffffffffff18;
  CAddress *in_stack_ffffffffffffff20;
  error_code *in_stack_ffffffffffffff28;
  SerParams *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>::
           GetParams<CAddress::SerParams>
                     ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
                      in_stack_ffffffffffffff18);
  if (pSVar2->fmt == Disk) {
    bVar4 = (pSVar2->super_SerParams).enc == V2;
    ActionUnserialize::
    SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,unsigned_int&>
              ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
               in_stack_ffffffffffffff18,(uint *)0x87ac1e);
    if (bVar4) {
      if ((!bVar4) || ((pSVar2->super_SerParams).enc != V2)) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        std::error_code::error_code<std::io_errc,void>
                  (in_stack_ffffffffffffff28,(io_errc)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"Unsupported CAddress disk format version");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0087aeea;
      }
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    if (pSVar2->fmt != Network) {
      __assert_fail("params.fmt == Format::Network",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/protocol.h"
                    ,0x1b2,
                    "static void CAddress::SerializationOps(Type &, Stream &, Operation) [Stream = ParamsStream<HashVerifier<AutoFile> &, CAddress::SerParams>, Type = CAddress, Operation = ActionUnserialize]"
                   );
    }
    bVar4 = (pSVar2->super_SerParams).enc == V2;
  }
  Using<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
            ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_ffffffffffffff20);
  ActionUnserialize::
  SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,Wrapper<ChronoFormatter<unsigned_int,true>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>>
            ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
             in_stack_ffffffffffffff18,
             (Wrapper<ChronoFormatter<unsigned_int,_true>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
              *)0x87ad6f);
  if (bVar4) {
    ActionUnserialize::
    SerWrite<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress&,CAddress::SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress,ActionUnserialize>(CAddress&,ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,ActionUnserialize)::_lambda(ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CAddress_const&)_1_>
              ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (anon_class_8_1_3712ffb4 *)in_stack_ffffffffffffff18);
    Using<CompactSizeFormatter<false>,unsigned_long&>((unsigned_long *)in_stack_ffffffffffffff20);
    ActionUnserialize::
    SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,Wrapper<CompactSizeFormatter<false>,unsigned_long&>>
              ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
               in_stack_ffffffffffffff18,
               (Wrapper<CompactSizeFormatter<false>,_unsigned_long_&> *)0x87add2);
    ActionUnserialize::
    SerRead<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress&,CAddress::SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress,ActionUnserialize>(CAddress&,ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,ActionUnserialize)::_lambda(ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CAddress&)_1_>
              ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (anon_class_8_1_3712ffb4 *)in_stack_ffffffffffffff18);
    this = &CNetAddr::V2;
  }
  else {
    Using<CustomUintFormatter<8,false>,ServiceFlags&>((ServiceFlags *)in_stack_ffffffffffffff20);
    ActionUnserialize::
    SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>>
              ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
               in_stack_ffffffffffffff18,
               (Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> *)0x87ae2d);
    this = &CNetAddr::V1;
  }
  AsBase<CService,CAddress>(in_stack_ffffffffffffff18);
  CNetAddr::SerParams::operator()(this,param_2);
  ActionUnserialize::
  SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,ParamsWrapper<CNetAddr::SerParams,CService>>
            ((ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)
             in_stack_ffffffffffffff18,(ParamsWrapper<CNetAddr::SerParams,_CService> *)0x87aea4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0087aeea:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CAddress, obj)
    {
        bool use_v2;
        auto& params = SER_PARAMS(SerParams);
        if (params.fmt == Format::Disk) {
            // In the disk serialization format, the encoding (v1 or v2) is determined by a flag version
            // that's part of the serialization itself. ADDRV2_FORMAT in the stream version only determines
            // whether V2 is chosen/permitted at all.
            uint32_t stored_format_version = DISK_VERSION_INIT;
            if (params.enc == Encoding::V2) stored_format_version |= DISK_VERSION_ADDRV2;
            READWRITE(stored_format_version);
            stored_format_version &= ~DISK_VERSION_IGNORE_MASK; // ignore low bits
            if (stored_format_version == 0) {
                use_v2 = false;
            } else if (stored_format_version == DISK_VERSION_ADDRV2 && params.enc == Encoding::V2) {
                // Only support v2 deserialization if V2 is set.
                use_v2 = true;
            } else {
                throw std::ios_base::failure("Unsupported CAddress disk format version");
            }
        } else {
            assert(params.fmt == Format::Network);
            // In the network serialization format, the encoding (v1 or v2) is determined directly by
            // the value of enc in the stream params, as no explicitly encoded version
            // exists in the stream.
            use_v2 = params.enc == Encoding::V2;
        }

        READWRITE(Using<LossyChronoFormatter<uint32_t>>(obj.nTime));
        // nServices is serialized as CompactSize in V2; as uint64_t in V1.
        if (use_v2) {
            uint64_t services_tmp;
            SER_WRITE(obj, services_tmp = obj.nServices);
            READWRITE(Using<CompactSizeFormatter<false>>(services_tmp));
            SER_READ(obj, obj.nServices = static_cast<ServiceFlags>(services_tmp));
        } else {
            READWRITE(Using<CustomUintFormatter<8>>(obj.nServices));
        }
        // Invoke V1/V2 serializer for CService parent object.
        const auto ser_params{use_v2 ? CNetAddr::V2 : CNetAddr::V1};
        READWRITE(ser_params(AsBase<CService>(obj)));
    }